

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_spirv_c.cpp
# Opt level: O0

void dxil_spv_converter_add_local_root_descriptor
               (dxil_spv_converter converter,dxil_spv_resource_class resource_class,
               uint register_space,uint register_index)

{
  uint *this;
  undefined1 local_58 [8];
  LocalRootParameter param;
  uint register_index_local;
  uint register_space_local;
  dxil_spv_resource_class resource_class_local;
  dxil_spv_converter converter_local;
  
  local_58._0_4_ = Constants;
  local_58._4_4_ = 0;
  param.type = Constants;
  param.local_constants.register_space = 0;
  param.local_constants.register_index = 0;
  param.local_constants.num_words = 0;
  param.local_descriptor.resource_class = SRV;
  this = &param.local_descriptor.register_index;
  param.table_entries.
  super__Vector_base<dxil_spv::DescriptorTableEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::DescriptorTableEntry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = register_index;
  memset(this,0,0x18);
  std::
  vector<dxil_spv::DescriptorTableEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::DescriptorTableEntry>_>
  ::vector((vector<dxil_spv::DescriptorTableEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::DescriptorTableEntry>_>
            *)this);
  local_58._0_4_ = Descriptor;
  param.local_constants.num_words = register_space;
  param.local_constants.register_index = resource_class;
  param.local_descriptor.resource_class =
       param.table_entries.
       super__Vector_base<dxil_spv::DescriptorTableEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::DescriptorTableEntry>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  std::vector<LocalRootParameter,_dxil_spv::ThreadLocalAllocator<LocalRootParameter>_>::push_back
            (&converter->local_root_parameters,(value_type *)local_58);
  LocalRootParameter::~LocalRootParameter((LocalRootParameter *)local_58);
  return;
}

Assistant:

void dxil_spv_converter_add_local_root_descriptor(dxil_spv_converter converter,
                                                  dxil_spv_resource_class resource_class,
                                                  unsigned register_space,
                                                  unsigned register_index)
{
	LocalRootParameter param = {};
	param.type = LocalRootParameterType::Descriptor;
	param.local_descriptor = { ResourceClass(resource_class), register_space, register_index };
	converter->local_root_parameters.push_back(std::move(param));
}